

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol.c
# Opt level: O3

int Test_SUNLinSolNumIters(SUNLinearSolver S,int myid)

{
  uint uVar1;
  
  uVar1 = SUNLinSolNumIters();
  sync_device();
  if (myid == 0) {
    printf("    PASSED test -- SUNLinSolNumIters (%d) \n",(ulong)uVar1);
    if (print_time != 0) {
      printf("    SUNLinSolNumIters Time: %22.15e \n \n",0);
    }
  }
  return 0;
}

Assistant:

int Test_SUNLinSolNumIters(SUNLinearSolver S, int myid)
{
  int numiters;
  double start_time, stop_time;

  /* the only way to fail this test is if the function is NULL,
     which will cause a seg-fault */
  start_time = get_time();
  numiters   = SUNLinSolNumIters(S);
  sync_device();
  stop_time = get_time();

  if (myid == 0)
  {
    printf("    PASSED test -- SUNLinSolNumIters (%d) \n", numiters);
    PRINT_TIME("    SUNLinSolNumIters Time: %22.15e \n \n",
               stop_time - start_time);
  }

  return (0);
}